

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::removeVertex
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint edge)

{
  AnchorVertex *second;
  AnchorVertex **ppAVar1;
  AnchorVertex *vertex;
  long lVar2;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_00;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  vertex = internalVertex(this,item,edge);
  if (vertex != (AnchorVertex *)0x0) {
    this_00 = (this->graph).m_data + (2 < (int)edge);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
    adjacentVertices((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_58,this_00,vertex);
    ppAVar1 = local_58.ptr;
    lVar2 = local_58.size << 3;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 8) {
      second = *(AnchorVertex **)((long)ppAVar1 + lVar3);
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::removeEdge
                (this_00,vertex,second);
      removeInternalVertex(this,item,edge);
      removeInternalVertex(this,second->m_item,second->m_edge);
    }
    QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeVertex(QGraphicsLayoutItem *item, Qt::AnchorPoint edge)
{
    if (AnchorVertex *v = internalVertex(item, edge)) {
        Graph<AnchorVertex, AnchorData> &g = graph[edgeOrientation(edge)];
        const auto allVertices = g.adjacentVertices(v);
        for (auto *v2 : allVertices) {
            g.removeEdge(v, v2);
            removeInternalVertex(item, edge);
            removeInternalVertex(v2->m_item, v2->m_edge);
        }
    }
}